

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3OffsetsFunc(sqlite3_context *pContext,int nVal,sqlite3_value **apVal)

{
  sqlite3_tokenizer_module *psVar1;
  int iVar2;
  uchar *z;
  ulong uVar3;
  code *xDel;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uint i;
  TermOffset *pp;
  char *z_00;
  TermOffset *pTVar7;
  Fts3Table *p;
  sqlite3_tokenizer_cursor *psVar8;
  bool bVar9;
  int iCurrent;
  int iEnd;
  int iStart;
  int NDUMMY;
  int nToken;
  Fts3Table *local_e8;
  uint local_dc;
  sqlite3_context *local_d8;
  sqlite3_tokenizer_cursor *pC;
  TermOffsetCtx sCtx;
  StrBuffer res;
  Fts3Cursor *pCsr;
  char *ZDUMMY;
  char local_78 [72];
  
  iVar2 = fts3FunctionArg(pContext,"offsets",*apVal,&pCsr);
  if ((iVar2 == 0) && (iVar2 = fts3CursorSeek(pContext,pCsr), iVar2 == 0)) {
    p = (Fts3Table *)(pCsr->base).pVtab;
    psVar1 = p->pTokenizer->pModule;
    res.z = (char *)0x0;
    res.n = 0;
    res.nAlloc = 0;
    if (pCsr->pExpr == (Fts3Expr *)0x0) {
      z_00 = "";
      iVar2 = 0;
      xDel = (_func_void_void_ptr *)0x0;
    }
    else {
      sCtx.iDocid = 0;
      sCtx.aTerm = (TermOffset *)0x0;
      sCtx.pCsr = (Fts3Cursor *)0x0;
      sCtx.iCol = 0;
      sCtx.iTerm = 0;
      iVar2 = fts3ExprLoadDoclists(pCsr,(int *)0x0,&nToken);
      if (iVar2 == 0) {
        sCtx.aTerm = (TermOffset *)sqlite3_malloc64((long)nToken << 4);
        if (sCtx.aTerm == (TermOffset *)0x0) {
          iVar2 = 7;
        }
        else {
          sCtx.iDocid = pCsr->iPrevId;
          sCtx.pCsr = pCsr;
          uVar6 = 0;
          local_e8 = p;
          local_d8 = pContext;
          while ((int)uVar6 < local_e8->nColumn) {
            NDUMMY = 0;
            iStart = 0;
            iEnd = 0;
            iCurrent = 0;
            sCtx._8_8_ = uVar6;
            fts3ExprIterate(pCsr->pExpr,fts3ExprTermOffsetInit,&sCtx);
            i = (int)uVar6 + 1;
            z = sqlite3_column_text(pCsr->pStmt,i);
            iVar2 = sqlite3_column_bytes(pCsr->pStmt,i);
            p = local_e8;
            if (z != (uchar *)0x0) {
              local_dc = i;
              iVar2 = sqlite3Fts3OpenTokenizer
                                (local_e8->pTokenizer,pCsr->iLangid,(char *)z,iVar2,&pC);
              psVar8 = pC;
              pContext = local_d8;
              if (iVar2 == 0) {
                iVar2 = (*psVar1->xNext)(pC,&ZDUMMY,&NDUMMY,&iStart,&iEnd,&iCurrent);
                do {
                  uVar3 = (ulong)(uint)nToken;
                  if (nToken < 1) {
                    uVar3 = 0;
                  }
                  do {
                    if (iVar2 != 0) {
                      (*psVar1->xClose)(psVar8);
                      pContext = local_d8;
                      p = local_e8;
                      i = local_dc;
                      if (iVar2 != 0x65) goto LAB_001ad3d5;
                      goto LAB_001ad66b;
                    }
                    iVar5 = 0x7fffffff;
                    pp = (TermOffset *)0x0;
                    uVar4 = uVar3;
                    pTVar7 = sCtx.aTerm;
                    while (bVar9 = uVar4 != 0, uVar4 = uVar4 - 1, bVar9) {
                      if ((pTVar7->pList != (char *)0x0) &&
                         (iVar2 = pTVar7->iPos - pTVar7->iOff, iVar2 < iVar5)) {
                        pp = pTVar7;
                        iVar5 = iVar2;
                      }
                      pTVar7 = pTVar7 + 1;
                    }
                    iVar2 = 0x65;
                  } while (pp == (TermOffset *)0x0);
                  if ((byte)*pp->pList < 2) {
                    pp->pList = (char *)0x0;
                  }
                  else {
                    fts3GetDeltaPosition(&pp->pList,&pp->iPos);
                  }
                  psVar8 = pC;
                  iVar2 = 0;
                  while ((iVar2 == 0 && (iCurrent < iVar5))) {
                    iVar2 = (*psVar1->xNext)(psVar8,&ZDUMMY,&NDUMMY,&iStart,&iEnd,&iCurrent);
                  }
                  if (iVar2 == 0) {
                    sqlite3_snprintf(0x40,local_78,"%d %d %d %d ",uVar6,
                                     (long)pp - (long)sCtx.aTerm >> 4,(ulong)(uint)iStart,
                                     iEnd - iStart);
                    iVar2 = fts3StringAppend(&res,local_78,-1);
                  }
                  else if ((iVar2 == 0x65) && (iVar2 = 0x65, local_e8->zContentTbl == (char *)0x0))
                  {
                    iVar2 = 0x10b;
                  }
                } while( true );
              }
              goto LAB_001ad3d5;
            }
            iVar2 = sqlite3_column_type(pCsr->pStmt,i);
            if (iVar2 != 5) {
              iVar2 = 7;
              pContext = local_d8;
              p = local_e8;
              goto LAB_001ad3d5;
            }
LAB_001ad66b:
            uVar6 = (ulong)i;
          }
          iVar2 = 0;
          pContext = local_d8;
          p = local_e8;
        }
      }
LAB_001ad3d5:
      sqlite3_free(sCtx.aTerm);
      sqlite3Fts3SegmentsClose(p);
      if (iVar2 != 0) {
        sqlite3_result_error_code(pContext,iVar2);
        sqlite3_free(res.z);
        return;
      }
      iVar2 = res.n + -1;
      xDel = sqlite3_free;
      z_00 = res.z;
    }
    sqlite3_result_text(pContext,z_00,iVar2,xDel);
  }
  return;
}

Assistant:

static void fts3OffsetsFunc(
  sqlite3_context *pContext,      /* SQLite function call context */
  int nVal,                       /* Size of argument array */
  sqlite3_value **apVal           /* Array of arguments */
){
  Fts3Cursor *pCsr;               /* Cursor handle passed through apVal[0] */

  UNUSED_PARAMETER(nVal);

  assert( nVal==1 );
  if( fts3FunctionArg(pContext, "offsets", apVal[0], &pCsr) ) return;
  assert( pCsr );
  if( SQLITE_OK==fts3CursorSeek(pContext, pCsr) ){
    sqlite3Fts3Offsets(pContext, pCsr);
  }
}